

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O3

string * __thiscall
Kernel::inputTypeName_abi_cxx11_(string *__return_storage_ptr__,Kernel *this,UnitInputType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "axiom";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "assumption";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "conjecture";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "negated conjecture";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "claim";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "extensionality axiom";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Kernel::inputTypeName(UnitInputType type)
{
  switch (type) {
    case UnitInputType::AXIOM:
      return "axiom";
    case UnitInputType::ASSUMPTION:
      return "assumption";
    case UnitInputType::CONJECTURE:
      return "conjecture";
    case UnitInputType::NEGATED_CONJECTURE:
      return "negated conjecture";
    case UnitInputType::CLAIM:
      return "claim";
    case UnitInputType::EXTENSIONALITY_AXIOM:
      return "extensionality axiom";
  default:
      return "unknown";
  }
}